

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfa.cc
# Opt level: O3

int __thiscall re2::NFA::Step(NFA *this,Threadq *runq,Threadq *nextq,int c,int flag,char *p)

{
  Inst *this_00;
  int iVar1;
  int iVar2;
  Thread *pTVar3;
  char **ppcVar4;
  bool bVar5;
  pointer pIVar6;
  char **ppcVar7;
  ostream *poVar8;
  ulong uVar9;
  uint uVar10;
  pointer pIVar11;
  LogMessage local_1b0;
  
  nextq->size_ = 0;
  if (runq->size_ != 0) {
    pIVar6 = (runq->dense_).
             super__Vector_base<re2::SparseArray<re2::NFA::Thread_*>::IndexValue,_std::allocator<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pIVar11 = pIVar6;
    do {
      pTVar3 = pIVar11->second;
      if (pTVar3 != (Thread *)0x0) {
        if (((this->longest_ != true) || (this->matched_ != true)) ||
           (*pTVar3->capture <= *this->match_)) {
          this_00 = this->prog_->inst_ + pIVar11->index_;
          uVar10 = this_00->out_opcode_ & 7;
          if (uVar10 == 1) {
            if ((pIVar11 == pIVar6) &&
               ((bVar5 = Prog::Inst::greedy(this_00,this->prog_), bVar5 || (this->longest_ == true))
               )) {
              iVar1 = this->ncapture_;
              if (0 < (long)iVar1) {
                ppcVar7 = this->match_;
                ppcVar4 = pTVar3->capture;
                uVar9 = 0;
                do {
                  ppcVar7[uVar9] = ppcVar4[uVar9];
                  ppcVar7[uVar9 + 1] = ppcVar4[uVar9 + 1];
                  uVar9 = uVar9 + 2;
                } while (uVar9 < (ulong)(long)iVar1);
              }
              this->matched_ = true;
              iVar2 = (pTVar3->field_0).ref;
              iVar1 = iVar2 + -1;
              (pTVar3->field_0).ref = iVar1;
              if (iVar2 < 2) {
                if (iVar1 != 0) goto LAB_00133da3;
                pTVar3->field_0 = (anon_union_8_2_62753a03_for_Thread_0)this->free_threads_;
                this->free_threads_ = pTVar3;
              }
              while( true ) {
                do {
                  do {
                    pIVar11 = pIVar11 + 1;
                    if (pIVar11 ==
                        (runq->dense_).
                        super__Vector_base<re2::SparseArray<re2::NFA::Thread_*>::IndexValue,_std::allocator<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>_>
                        ._M_impl.super__Vector_impl_data._M_start + runq->size_) {
                      runq->size_ = 0;
                      bVar5 = Prog::Inst::greedy(this_00,this->prog_);
                      if (!bVar5) {
                        return this_00->out_opcode_ >> 4;
                      }
                      if ((this_00->out_opcode_ & 6) == 0) {
                        return (this_00->field_1).cap_;
                      }
                      __assert_fail("opcode() == kInstAlt || opcode() == kInstAltMatch",
                                    "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/prog.h"
                                    ,0x6d,"int re2::Prog::Inst::out1()");
                    }
                    pTVar3 = pIVar11->second;
                  } while (pTVar3 == (Thread *)0x0);
                  iVar2 = (pTVar3->field_0).ref;
                  iVar1 = iVar2 + -1;
                  (pTVar3->field_0).ref = iVar1;
                } while (1 < iVar2);
                if (iVar1 != 0) break;
                pTVar3->field_0 = (anon_union_8_2_62753a03_for_Thread_0)this->free_threads_;
                this->free_threads_ = pTVar3;
              }
LAB_00133da3:
              __assert_fail("(t->ref) == (0)",
                            "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/nfa.cc"
                            ,0xb7,"void re2::NFA::Decref(Thread *)");
            }
          }
          else if (uVar10 == 2) {
            AddToThreadq(this,nextq,this_00->out_opcode_ >> 4,c,flag,p + 1,pTVar3);
          }
          else if (uVar10 == 5) {
            if ((this->endmatch_ != true) || (this->etext_ == p)) {
              if (this->longest_ == false) {
                ppcVar7 = this->match_;
                iVar1 = this->ncapture_;
                if (0 < (long)iVar1) {
                  ppcVar4 = pTVar3->capture;
                  uVar9 = 0;
                  do {
                    ppcVar7[uVar9] = ppcVar4[uVar9];
                    ppcVar7[uVar9 + 1] = ppcVar4[uVar9 + 1];
                    uVar9 = uVar9 + 2;
                  } while (uVar9 < (ulong)(long)iVar1);
                  ppcVar7 = this->match_;
                }
                ppcVar7[1] = p;
                this->matched_ = true;
                iVar2 = (pTVar3->field_0).ref;
                iVar1 = iVar2 + -1;
                (pTVar3->field_0).ref = iVar1;
                if (iVar2 < 2) {
                  if (iVar1 != 0) goto LAB_00133da3;
                  pTVar3->field_0 = (anon_union_8_2_62753a03_for_Thread_0)this->free_threads_;
                  this->free_threads_ = pTVar3;
                }
                while (pIVar11 = pIVar11 + 1,
                      pIVar11 !=
                      (runq->dense_).
                      super__Vector_base<re2::SparseArray<re2::NFA::Thread_*>::IndexValue,_std::allocator<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>_>
                      ._M_impl.super__Vector_impl_data._M_start + runq->size_) {
                  pTVar3 = pIVar11->second;
                  if (pTVar3 != (Thread *)0x0) {
                    iVar2 = (pTVar3->field_0).ref;
                    iVar1 = iVar2 + -1;
                    (pTVar3->field_0).ref = iVar1;
                    if (iVar2 < 2) {
                      if (iVar1 != 0) goto LAB_00133da3;
                      pTVar3->field_0 = (anon_union_8_2_62753a03_for_Thread_0)this->free_threads_;
                      this->free_threads_ = pTVar3;
                    }
                  }
                }
                break;
              }
              ppcVar7 = this->match_;
              ppcVar4 = pTVar3->capture;
              if (((this->matched_ != true) || (*ppcVar4 < *ppcVar7)) ||
                 ((*ppcVar4 == *ppcVar7 && (ppcVar7[1] < p)))) {
                iVar1 = this->ncapture_;
                if (0 < (long)iVar1) {
                  uVar9 = 0;
                  do {
                    ppcVar7[uVar9] = ppcVar4[uVar9];
                    ppcVar7[uVar9 + 1] = ppcVar4[uVar9 + 1];
                    uVar9 = uVar9 + 2;
                  } while (uVar9 < (ulong)(long)iVar1);
                  ppcVar7 = this->match_;
                }
                ppcVar7[1] = p;
                this->matched_ = true;
              }
            }
          }
          else {
            LogMessage::LogMessage
                      (&local_1b0,
                       "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/nfa.cc"
                       ,0x15d,3);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1b0.str_,"Unhandled ",10);
            poVar8 = (ostream *)
                     std::ostream::operator<<((ostream *)&local_1b0.str_,this_00->out_opcode_ & 7);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8," in step",8);
            LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b0);
          }
        }
        iVar2 = (pTVar3->field_0).ref;
        iVar1 = iVar2 + -1;
        (pTVar3->field_0).ref = iVar1;
        if (iVar2 < 2) {
          if (iVar1 != 0) goto LAB_00133da3;
          pTVar3->field_0 = (anon_union_8_2_62753a03_for_Thread_0)this->free_threads_;
          this->free_threads_ = pTVar3;
        }
      }
      pIVar11 = pIVar11 + 1;
      pIVar6 = (runq->dense_).
               super__Vector_base<re2::SparseArray<re2::NFA::Thread_*>::IndexValue,_std::allocator<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (pIVar11 != pIVar6 + runq->size_);
  }
  runq->size_ = 0;
  return 0;
}

Assistant:

int NFA::Step(Threadq* runq, Threadq* nextq, int c, int flag, const char* p) {
  nextq->clear();

  for (Threadq::iterator i = runq->begin(); i != runq->end(); ++i) {
    Thread* t = i->second;
    if (t == NULL)
      continue;

    if (longest_) {
      // Can skip any threads started after our current best match.
      if (matched_ && match_[0] < t->capture[0]) {
        Decref(t);
        continue;
      }
    }

    int id = i->index();
    Prog::Inst* ip = prog_->inst(id);

    switch (ip->opcode()) {
      default:
        // Should only see the values handled below.
        LOG(DFATAL) << "Unhandled " << ip->opcode() << " in step";
        break;

      case kInstByteRange:
        AddToThreadq(nextq, ip->out(), c, flag, p+1, t);
        break;

      case kInstAltMatch:
        if (i != runq->begin())
          break;
        // The match is ours if we want it.
        if (ip->greedy(prog_) || longest_) {
          CopyCapture(match_, t->capture);
          matched_ = true;

          Decref(t);
          for (++i; i != runq->end(); ++i)
            Decref(i->second);
          runq->clear();
          if (ip->greedy(prog_))
            return ip->out1();
          return ip->out();
        }
        break;

      case kInstMatch:
        if (endmatch_ && p != etext_)
          break;

        if (longest_) {
          // Leftmost-longest mode: save this match only if
          // it is either farther to the left or at the same
          // point but longer than an existing match.
          if (!matched_ || t->capture[0] < match_[0] ||
              (t->capture[0] == match_[0] && p > match_[1])) {
            CopyCapture(match_, t->capture);
            match_[1] = p;
            matched_ = true;
          }
        } else {
          // Leftmost-biased mode: this match is by definition
          // better than what we've already found (see next line).
          CopyCapture(match_, t->capture);
          match_[1] = p;
          matched_ = true;

          // Cut off the threads that can only find matches
          // worse than the one we just found: don't run the
          // rest of the current Threadq.
          Decref(t);
          for (++i; i != runq->end(); ++i)
            Decref(i->second);
          runq->clear();
          return 0;
        }
        break;
    }
    Decref(t);
  }
  runq->clear();
  return 0;
}